

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

void __thiscall
glslang::TInputScanner::consumeWhitespaceComment(TInputScanner *this,bool *foundNonSpaceTab)

{
  bool bVar1;
  int iVar2;
  
  do {
    consumeWhiteSpace(this,foundNonSpaceTab);
    iVar2 = peek(this);
    if (iVar2 != 0x2f) {
      return;
    }
    *foundNonSpaceTab = true;
    bVar1 = consumeComment(this);
  } while (bVar1);
  return;
}

Assistant:

void TInputScanner::consumeWhitespaceComment(bool& foundNonSpaceTab)
{
    do {
        consumeWhiteSpace(foundNonSpaceTab);

        // if not starting a comment now, then done
        int c = peek();
        if (c != '/' || c == EndOfInput)
            return;

        // skip potential comment
        foundNonSpaceTab = true;
        if (! consumeComment())
            return;

    } while (true);
}